

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall ExprWriterTest_WriteIfExpr_Test::TestBody(ExprWriterTest_WriteIfExpr_Test *this)

{
  NumericExpr lhs;
  NumericExpr else_expr;
  NumericExpr lhs_00;
  NumericExpr else_expr_00;
  CStringRef arg0;
  CStringRef arg0_00;
  undefined1 uVar1;
  bool bVar2;
  AssertHelper *this_00;
  long in_RDI;
  ExprBase other;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  NumericConstant n1;
  NumericConstant n0;
  ExprWriterTest *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  ExprBase in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  int line;
  ExprBase in_stack_fffffffffffffe40;
  char *file;
  ExprBase in_stack_fffffffffffffe48;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  Message *in_stack_fffffffffffffe98;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> message;
  AssertHelper *in_stack_fffffffffffffea0;
  char local_110 [8];
  BasicCStringRef<char> local_108;
  string local_100 [32];
  AssertionResult local_e0 [3];
  Impl *local_b0;
  Message *local_a0;
  Impl *local_90;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_80;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_70;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_60;
  BasicCStringRef<char> local_50;
  string local_48 [32];
  AssertionResult local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_10;
  
  local_10.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffe18,5.67600400305674e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffe18,5.67613246012466e-318);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"{}");
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffe18,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (Reference)in_stack_fffffffffffffe30.impl_,
             (type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  local_90 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)in_stack_fffffffffffffe30.impl_,
             (type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  lhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe3c;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe38;
  local_70.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                  (Kind)((ulong)in_stack_fffffffffffffe20 >> 0x20),lhs,
                  (NumericExpr)in_stack_fffffffffffffe30.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_fffffffffffffe30.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  local_a0 = (Message *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)in_stack_fffffffffffffe30.impl_,
             (type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  local_b0 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)in_stack_fffffffffffffe30.impl_,
             (type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  else_expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe3c;
  else_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe38;
  local_60.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffe30.impl_,
                  (LogicalExpr)in_stack_fffffffffffffe48.impl_,
                  (NumericExpr)in_stack_fffffffffffffe40.impl_,else_expr);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffe30.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  arg0.data_._7_1_ = in_stack_fffffffffffffe5f;
  arg0.data_._0_7_ = in_stack_fffffffffffffe58;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe50);
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (char *)in_stack_fffffffffffffe30.impl_,
             (char (*) [17])CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_48);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe50 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1189e9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,(Type)((ulong)in_stack_fffffffffffffe48.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffe40.impl_,in_stack_fffffffffffffe3c,
               (char *)in_stack_fffffffffffffe30.impl_);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x118a46);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118a9e);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_108,"{}");
  other.impl_ = (Impl *)(in_RDI + 0x10);
  line = 0;
  mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
            ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffe18,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),(Reference)other.impl_,
             (type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  lhs_00.super_ExprBase.impl_._4_4_ = line;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe38;
  mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (Kind)((ulong)in_stack_fffffffffffffe20 >> 0x20),lhs_00,(NumericExpr)other.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  message.super_ExprBase.impl_ = (ExprBase)(ExprBase)local_18;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  else_expr_00.super_ExprBase.impl_._4_4_ = line;
  else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe38;
  mp::BasicExprFactory<std::allocator<char>_>::MakeIf
            ((BasicExprFactory<std::allocator<char>_> *)other.impl_,
             (LogicalExpr)in_stack_fffffffffffffe48.impl_,
             (NumericExpr)in_stack_fffffffffffffe40.impl_,else_expr_00);
  file = local_110;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,(type)((ulong)in_stack_fffffffffffffe20 >> 0x20));
  type = (Type)((ulong)local_100 >> 0x20);
  arg0_00.data_._7_1_ = uVar1;
  arg0_00.data_._0_7_ = in_stack_fffffffffffffe58;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe50);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffe38),(char *)other.impl_,
             (char (*) [24])CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_100);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_e0);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x118cd0)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffea0,(Message *)message.super_ExprBase.impl_);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x118d1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x118d6d);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteIfExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if x1 = 0 then 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n1, n0));
  CHECK_WRITE("if x1 = 0 then 0 else 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n0, n1));
}